

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# httplib.h
# Opt level: O1

bool __thiscall
httplib::Server::write_content_with_provider
          (Server *this,Stream *strm,Request *req,Response *res,string *boundary,
          string *content_type)

{
  pointer ppVar1;
  pointer ppVar2;
  anon_class_24_3_e73717fb content;
  bool bVar3;
  EncodingType EVar4;
  compressor *compressor;
  ulong offset;
  ulong uVar5;
  ulong uVar6;
  size_t length;
  anon_class_8_1_8991fb9c is_shutting_down;
  Error error;
  anon_class_8_1_8991fb9c local_38;
  undefined8 local_30;
  Response *pRStack_28;
  anon_class_8_1_8991fb9c *local_20;
  
  length = res->content_length_;
  local_38.this = this;
  if (length == 0) {
    if (res->is_chunked_content_provider_ == true) {
      EVar4 = detail::encoding_type(req,res);
      if (EVar4 - Gzip < 2) {
        compressor = (compressor *)0x0;
      }
      else {
        compressor = (compressor *)operator_new(8);
        compressor->_vptr_compressor = (_func_int **)&PTR__compressor_0018b538;
      }
      if (compressor == (compressor *)0x0) {
        __assert_fail("compressor != nullptr",
                      "/workspace/llm4binary/github/license_all_cmakelists_1510/nickware44[P]interference/3rdparty/httplib.h"
                      ,0x15d0,
                      "bool httplib::Server::write_content_with_provider(Stream &, const Request &, Response &, const std::string &, const std::string &)"
                     );
      }
      local_30 = (Stream *)((ulong)local_30._4_4_ << 0x20);
      bVar3 = detail::
              write_content_chunked<httplib::Server::write_content_with_provider(httplib::Stream&,httplib::Request_const&,httplib::Response&,std::__cxx11::string_const&,std::__cxx11::string_const&)::_lambda()_1_,httplib::detail::compressor>
                        (strm,&res->content_provider_,&local_38,compressor,(Error *)&local_30);
      (*compressor->_vptr_compressor[1])(compressor);
    }
    else {
      bVar3 = detail::
              write_content_without_length<httplib::Server::write_content_with_provider(httplib::Stream&,httplib::Request_const&,httplib::Response&,std::__cxx11::string_const&,std::__cxx11::string_const&)::_lambda()_1_>
                        (strm,&res->content_provider_,&local_38);
    }
  }
  else {
    ppVar1 = (req->ranges).
             super__Vector_base<std::pair<long,_long>,_std::allocator<std::pair<long,_long>_>_>.
             _M_impl.super__Vector_impl_data._M_start;
    ppVar2 = (req->ranges).
             super__Vector_base<std::pair<long,_long>,_std::allocator<std::pair<long,_long>_>_>.
             _M_impl.super__Vector_impl_data._M_finish;
    if (ppVar1 == ppVar2) {
      offset = 0;
    }
    else {
      if ((long)ppVar2 - (long)ppVar1 != 0x10) {
        local_20 = &local_38;
        content.res = res;
        content.strm = strm;
        content.is_shutting_down = local_20;
        local_30 = strm;
        pRStack_28 = res;
        bVar3 = detail::
                process_multipart_ranges_data<httplib::detail::write_multipart_ranges_data<httplib::Server::write_content_with_provider(httplib::Stream&,httplib::Request_const&,httplib::Response&,std::__cxx11::string_const&,std::__cxx11::string_const&)::_lambda()_1_>(httplib::Stream&,httplib::Request_const&,httplib::Response&,std::__cxx11::string_const&,std::__cxx11::string_const&,httplib::Server::write_content_with_provider(httplib::Stream&,httplib::Request_const&,httplib::Response&,std::__cxx11::string_const&,std::__cxx11::string_const&)::_lambda()_1_const&)::_lambda(std::__cxx11::string_const&)_1_,httplib::detail::write_multipart_ranges_data<httplib::Server::write_content_with_provider(httplib::Stream&,httplib::Request_const&,httplib::Response&,std::__cxx11::string_const&,std::__cxx11::string_const&)::_lambda()_1_>(httplib::Stream&,httplib::Request_const&,httplib::Response&,std::__cxx11::string_const&,std::__cxx11::string_const&,httplib::Server::write_content_with_provider(httplib::Stream&,httplib::Request_const&,httplib::Response&,std::__cxx11::string_const&,std::__cxx11::string_const&)::_lambda()_1_const&)::_lambda(std::__cxx11::string_const&)_2_,httplib::detail::write_multipart_ranges_data<httplib::Server::write_content_with_provider(httplib::Stream&,httplib::Request_const&,httplib::Response&,std::__cxx11::string_const&,std::__cxx11::string_const&)::_lambda()_1_>(httplib::Stream&,httplib::Request_const&,httplib::Response&,std::__cxx11::string_const&,std::__cxx11::string_const&,httplib::Server::write_content_with_provider(httplib::Stream&,httplib::Request_const&,httplib::Response&,std::__cxx11::string_const&,std::__cxx11::string_const&)::_lambda()_1_const&)::_lambda(unsigned_long,unsigned_long)_1_>
                          (req,res,boundary,content_type,(anon_class_8_1_8991b55a)strm,
                           (anon_class_8_1_8991b55a)strm,content);
        return bVar3;
      }
      offset = ppVar1->first;
      uVar6 = ppVar1->second;
      if ((offset & uVar6) == 0xffffffffffffffff) {
        offset = 0;
      }
      else {
        uVar5 = 0;
        if (0 < (long)(length - uVar6)) {
          uVar5 = length - uVar6;
        }
        if (offset == 0xffffffffffffffff) {
          uVar6 = length - 1;
          offset = uVar5;
        }
        if (uVar6 == 0xffffffffffffffff) {
          uVar6 = length - 1;
        }
        length = (uVar6 - offset) + 1;
      }
    }
    local_30 = (Stream *)((ulong)local_30 & 0xffffffff00000000);
    bVar3 = detail::
            write_content<httplib::Server::write_content_with_provider(httplib::Stream&,httplib::Request_const&,httplib::Response&,std::__cxx11::string_const&,std::__cxx11::string_const&)::_lambda()_1_>
                      (strm,&res->content_provider_,offset,length,(anon_class_8_1_8991fb9c)this,
                       (Error *)&local_30);
  }
  return bVar3;
}

Assistant:

inline bool
Server::write_content_with_provider(Stream &strm, const Request &req,
                                    Response &res, const std::string &boundary,
                                    const std::string &content_type) {
  auto is_shutting_down = [this]() {
    return this->svr_sock_ == INVALID_SOCKET;
  };

  if (res.content_length_ > 0) {
    if (req.ranges.empty()) {
      return detail::write_content(strm, res.content_provider_, 0,
                                   res.content_length_, is_shutting_down);
    } else if (req.ranges.size() == 1) {
      auto offsets =
          detail::get_range_offset_and_length(req, res.content_length_, 0);
      auto offset = offsets.first;
      auto length = offsets.second;
      return detail::write_content(strm, res.content_provider_, offset, length,
                                   is_shutting_down);
    } else {
      return detail::write_multipart_ranges_data(
          strm, req, res, boundary, content_type, is_shutting_down);
    }
  } else {
    if (res.is_chunked_content_provider_) {
      auto type = detail::encoding_type(req, res);

      std::unique_ptr<detail::compressor> compressor;
      if (type == detail::EncodingType::Gzip) {
#ifdef CPPHTTPLIB_ZLIB_SUPPORT
        compressor = detail::make_unique<detail::gzip_compressor>();
#endif
      } else if (type == detail::EncodingType::Brotli) {
#ifdef CPPHTTPLIB_BROTLI_SUPPORT
        compressor = detail::make_unique<detail::brotli_compressor>();
#endif
      } else {
        compressor = detail::make_unique<detail::nocompressor>();
      }
      assert(compressor != nullptr);

      return detail::write_content_chunked(strm, res.content_provider_,
                                           is_shutting_down, *compressor);
    } else {
      return detail::write_content_without_length(strm, res.content_provider_,
                                                  is_shutting_down);
    }
  }
}